

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idct.c
# Opt level: O0

void av1_highbd_inv_txfm_add_c(tran_low_t *input,uint8_t *dest,int stride,TxfmParam *txfm_param)

{
  undefined1 uVar1;
  tran_low_t *in_RCX;
  undefined4 in_EDX;
  tran_low_t *in_RSI;
  uint8_t *in_RDI;
  tran_low_t *unaff_retaddr;
  TX_SIZE tx_size;
  TxfmParam *in_stack_ffffffffffffffc8;
  undefined7 in_stack_ffffffffffffffd8;
  int stride_00;
  undefined4 in_stack_ffffffffffffffe8;
  
  uVar1 = *(undefined1 *)((long)in_RCX + 1);
  stride_00 = (int)((ulong)in_RCX >> 0x20);
  switch(uVar1) {
  case 0:
    highbd_inv_txfm_add_4x4_c
              (unaff_retaddr,in_RDI,(int)((ulong)in_RSI >> 0x20),
               (TxfmParam *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8));
    break;
  case 1:
    highbd_inv_txfm_add_8x8_c
              (in_RSI,(uint8_t *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),stride_00,
               (TxfmParam *)CONCAT17(uVar1,in_stack_ffffffffffffffd8));
    break;
  case 2:
    highbd_inv_txfm_add_16x16_c
              (in_RSI,(uint8_t *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),stride_00,
               (TxfmParam *)CONCAT17(uVar1,in_stack_ffffffffffffffd8));
    break;
  case 3:
    highbd_inv_txfm_add_32x32_c
              (in_RSI,(uint8_t *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),stride_00,
               (TxfmParam *)CONCAT17(uVar1,in_stack_ffffffffffffffd8));
    break;
  case 4:
    highbd_inv_txfm_add_64x64_c
              (in_RSI,(uint8_t *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),stride_00,
               (TxfmParam *)CONCAT17(uVar1,in_stack_ffffffffffffffd8));
    break;
  case 5:
    highbd_inv_txfm_add_4x8_c
              (in_RCX,(uint8_t *)CONCAT17(uVar1,in_stack_ffffffffffffffd8),0,
               in_stack_ffffffffffffffc8);
    break;
  case 6:
    highbd_inv_txfm_add_8x4_c
              (in_RCX,(uint8_t *)CONCAT17(uVar1,in_stack_ffffffffffffffd8),0,
               in_stack_ffffffffffffffc8);
    break;
  case 7:
    highbd_inv_txfm_add_8x16_c
              (in_RCX,(uint8_t *)CONCAT17(uVar1,in_stack_ffffffffffffffd8),0,
               in_stack_ffffffffffffffc8);
    break;
  case 8:
    highbd_inv_txfm_add_16x8_c
              (in_RCX,(uint8_t *)CONCAT17(uVar1,in_stack_ffffffffffffffd8),0,
               in_stack_ffffffffffffffc8);
    break;
  case 9:
    highbd_inv_txfm_add_16x32_c
              (in_RCX,(uint8_t *)CONCAT17(uVar1,in_stack_ffffffffffffffd8),0,
               in_stack_ffffffffffffffc8);
    break;
  case 10:
    highbd_inv_txfm_add_32x16_c
              (in_RCX,(uint8_t *)CONCAT17(uVar1,in_stack_ffffffffffffffd8),0,
               in_stack_ffffffffffffffc8);
    break;
  case 0xb:
    highbd_inv_txfm_add_32x64_c
              (in_RCX,(uint8_t *)CONCAT17(uVar1,in_stack_ffffffffffffffd8),0,
               in_stack_ffffffffffffffc8);
    break;
  case 0xc:
    highbd_inv_txfm_add_64x32_c
              (in_RCX,(uint8_t *)CONCAT17(uVar1,in_stack_ffffffffffffffd8),0,
               in_stack_ffffffffffffffc8);
    break;
  case 0xd:
    highbd_inv_txfm_add_4x16_c
              (in_RCX,(uint8_t *)CONCAT17(uVar1,in_stack_ffffffffffffffd8),0,
               in_stack_ffffffffffffffc8);
    break;
  case 0xe:
    highbd_inv_txfm_add_16x4_c
              (in_RCX,(uint8_t *)CONCAT17(uVar1,in_stack_ffffffffffffffd8),0,
               in_stack_ffffffffffffffc8);
    break;
  case 0xf:
    highbd_inv_txfm_add_8x32_c
              (in_RCX,(uint8_t *)CONCAT17(uVar1,in_stack_ffffffffffffffd8),0,
               in_stack_ffffffffffffffc8);
    break;
  case 0x10:
    highbd_inv_txfm_add_32x8_c
              (in_RCX,(uint8_t *)CONCAT17(uVar1,in_stack_ffffffffffffffd8),0,
               in_stack_ffffffffffffffc8);
    break;
  case 0x11:
    highbd_inv_txfm_add_16x64_c
              (in_RCX,(uint8_t *)CONCAT17(uVar1,in_stack_ffffffffffffffd8),0,
               in_stack_ffffffffffffffc8);
    break;
  case 0x12:
    highbd_inv_txfm_add_64x16_c
              (in_RCX,(uint8_t *)CONCAT17(uVar1,in_stack_ffffffffffffffd8),0,
               in_stack_ffffffffffffffc8);
  }
  return;
}

Assistant:

void av1_highbd_inv_txfm_add_c(const tran_low_t *input, uint8_t *dest,
                               int stride, const TxfmParam *txfm_param) {
  assert(av1_ext_tx_used[txfm_param->tx_set_type][txfm_param->tx_type]);
  const TX_SIZE tx_size = txfm_param->tx_size;
  switch (tx_size) {
    case TX_32X32:
      highbd_inv_txfm_add_32x32_c(input, dest, stride, txfm_param);
      break;
    case TX_16X16:
      highbd_inv_txfm_add_16x16_c(input, dest, stride, txfm_param);
      break;
    case TX_8X8:
      highbd_inv_txfm_add_8x8_c(input, dest, stride, txfm_param);
      break;
    case TX_4X8:
      highbd_inv_txfm_add_4x8_c(input, dest, stride, txfm_param);
      break;
    case TX_8X4:
      highbd_inv_txfm_add_8x4_c(input, dest, stride, txfm_param);
      break;
    case TX_8X16:
      highbd_inv_txfm_add_8x16_c(input, dest, stride, txfm_param);
      break;
    case TX_16X8:
      highbd_inv_txfm_add_16x8_c(input, dest, stride, txfm_param);
      break;
    case TX_16X32:
      highbd_inv_txfm_add_16x32_c(input, dest, stride, txfm_param);
      break;
    case TX_32X16:
      highbd_inv_txfm_add_32x16_c(input, dest, stride, txfm_param);
      break;
    case TX_64X64:
      highbd_inv_txfm_add_64x64_c(input, dest, stride, txfm_param);
      break;
    case TX_32X64:
      highbd_inv_txfm_add_32x64_c(input, dest, stride, txfm_param);
      break;
    case TX_64X32:
      highbd_inv_txfm_add_64x32_c(input, dest, stride, txfm_param);
      break;
    case TX_16X64:
      highbd_inv_txfm_add_16x64_c(input, dest, stride, txfm_param);
      break;
    case TX_64X16:
      highbd_inv_txfm_add_64x16_c(input, dest, stride, txfm_param);
      break;
    case TX_4X4:
      // this is like av1_short_idct4x4 but has a special case around eob<=1
      // which is significant (not just an optimization) for the lossless
      // case.
      highbd_inv_txfm_add_4x4_c(input, dest, stride, txfm_param);
      break;
    case TX_16X4:
      highbd_inv_txfm_add_16x4_c(input, dest, stride, txfm_param);
      break;
    case TX_4X16:
      highbd_inv_txfm_add_4x16_c(input, dest, stride, txfm_param);
      break;
    case TX_8X32:
      highbd_inv_txfm_add_8x32_c(input, dest, stride, txfm_param);
      break;
    case TX_32X8:
      highbd_inv_txfm_add_32x8_c(input, dest, stride, txfm_param);
      break;
    default: assert(0 && "Invalid transform size"); break;
  }
}